

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionRequestPdu.cpp
# Opt level: O1

bool __thiscall DIS::ActionRequestPdu::operator==(ActionRequestPdu *this,ActionRequestPdu *rhs)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  pointer pFVar4;
  pointer pVVar5;
  long lVar6;
  ulong uVar7;
  
  bVar1 = SimulationManagementFamilyPdu::operator==
                    (&this->super_SimulationManagementFamilyPdu,
                     &rhs->super_SimulationManagementFamilyPdu);
  bVar2 = EntityID::operator==(&this->_originatingID,&rhs->_originatingID);
  bVar3 = EntityID::operator==(&this->_receivingID,&rhs->_receivingID);
  bVar1 = this->_actionID == rhs->_actionID &&
          (this->_requestID == rhs->_requestID && (bVar3 && (bVar2 && bVar1)));
  pFVar4 = (this->_fixedDatums).
           super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_fixedDatums).super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>.
      _M_impl.super__Vector_impl_data._M_finish != pFVar4) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      bVar2 = FixedDatum::operator==
                        ((FixedDatum *)((long)&pFVar4->_vptr_FixedDatum + lVar6),
                         (FixedDatum *)
                         ((long)&((rhs->_fixedDatums).
                                  super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_vptr_FixedDatum +
                         lVar6));
      if (!bVar2) {
        bVar1 = false;
      }
      uVar7 = uVar7 + 1;
      pFVar4 = (this->_fixedDatums).
               super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x10;
    } while (uVar7 < (ulong)((long)(this->_fixedDatums).
                                   super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar4 >> 4));
  }
  pVVar5 = (this->_variableDatums).
           super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_variableDatums).
      super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar5) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      bVar2 = VariableDatum::operator==
                        ((VariableDatum *)((long)&pVVar5->_vptr_VariableDatum + lVar6),
                         (VariableDatum *)
                         ((long)&((rhs->_variableDatums).
                                  super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_vptr_VariableDatum +
                         lVar6));
      if (!bVar2) {
        bVar1 = false;
      }
      uVar7 = uVar7 + 1;
      pVVar5 = (this->_variableDatums).
               super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x30;
    } while (uVar7 < (ulong)(((long)(this->_variableDatums).
                                    super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5 >> 4)
                            * -0x5555555555555555));
  }
  return bVar1;
}

Assistant:

bool ActionRequestPdu::operator ==(const ActionRequestPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = SimulationManagementFamilyPdu::operator==(rhs);

     if( ! (_originatingID == rhs._originatingID) ) ivarsEqual = false;
     if( ! (_receivingID == rhs._receivingID) ) ivarsEqual = false;
     if( ! (_requestID == rhs._requestID) ) ivarsEqual = false;
     if( ! (_actionID == rhs._actionID) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _fixedDatums.size(); idx++)
     {
        if( ! ( _fixedDatums[idx] == rhs._fixedDatums[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _variableDatums.size(); idx++)
     {
        if( ! ( _variableDatums[idx] == rhs._variableDatums[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }